

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O0

void llvm::APInt::tcShiftLeft(WordType *Dst,uint Words,uint Count)

{
  bool bVar1;
  uint *puVar2;
  sbyte sVar3;
  uint uVar4;
  uint local_20;
  uint BitShift;
  uint local_18;
  uint WordShift;
  uint Count_local;
  uint Words_local;
  WordType *Dst_local;
  
  if (Count != 0) {
    local_20 = Count >> 6;
    local_18 = Count;
    WordShift = Words;
    _Count_local = Dst;
    puVar2 = std::min<unsigned_int>(&local_20,&WordShift);
    BitShift = *puVar2;
    if ((local_18 & 0x3f) == 0) {
      memmove(_Count_local + BitShift,_Count_local,(ulong)((WordShift - BitShift) * 8));
    }
    else {
      while (uVar4 = WordShift - 1, bVar1 = BitShift < WordShift, WordShift = uVar4, bVar1) {
        sVar3 = (sbyte)(local_18 & 0x3f);
        _Count_local[uVar4] = _Count_local[uVar4 - BitShift] << sVar3;
        if (BitShift < uVar4) {
          _Count_local[uVar4] =
               _Count_local[(uVar4 - BitShift) - 1] >> (0x40U - sVar3 & 0x3f) | _Count_local[uVar4];
        }
      }
    }
    memset(_Count_local,0,(ulong)(BitShift << 3));
  }
  return;
}

Assistant:

void APInt::tcShiftLeft(WordType *Dst, unsigned Words, unsigned Count) {
  // Don't bother performing a no-op shift.
  if (!Count)
    return;

  // WordShift is the inter-part shift; BitShift is the intra-part shift.
  unsigned WordShift = std::min(Count / APINT_BITS_PER_WORD, Words);
  unsigned BitShift = Count % APINT_BITS_PER_WORD;

  // Fastpath for moving by whole words.
  if (BitShift == 0) {
    std::memmove(Dst + WordShift, Dst, (Words - WordShift) * APINT_WORD_SIZE);
  } else {
    while (Words-- > WordShift) {
      Dst[Words] = Dst[Words - WordShift] << BitShift;
      if (Words > WordShift)
        Dst[Words] |=
          Dst[Words - WordShift - 1] >> (APINT_BITS_PER_WORD - BitShift);
    }
  }

  // Fill in the remainder with 0s.
  std::memset(Dst, 0, WordShift * APINT_WORD_SIZE);
}